

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromBinaryWithSize(uchar *value,size_t size)

{
  SimpleString *in_RDX;
  SimpleString *in_RDI;
  size_t displayedSize;
  SimpleString *result;
  SimpleString *pSVar1;
  SimpleString *rhs;
  SimpleString *value_00;
  char *in_stack_ffffffffffffffc8;
  SimpleString *in_stack_ffffffffffffffd0;
  
  value_00 = in_RDI;
  StringFromFormat((char *)in_RDI,"Size = %u | HexContents = ",(ulong)in_RDX & 0xffffffff);
  pSVar1 = in_RDX;
  if ((SimpleString *)0x80 < in_RDX) {
    pSVar1 = (SimpleString *)0x80;
  }
  rhs = pSVar1;
  StringFromBinaryOrNull((uchar *)value_00,(size_t)in_RDI);
  SimpleString::operator+=(in_RDI,rhs);
  SimpleString::~SimpleString((SimpleString *)0x20c673);
  if (pSVar1 < in_RDX) {
    SimpleString::operator+=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return (SimpleString)(char *)value_00;
}

Assistant:

SimpleString StringFromBinaryWithSize(const unsigned char* value, size_t size)
{
    SimpleString result = StringFromFormat("Size = %u | HexContents = ", (unsigned) size);
    size_t displayedSize = ((size > 128) ? 128 : size);
    result += StringFromBinaryOrNull(value, displayedSize);
    if (size > displayedSize)
    {
        result += " ...";
    }
    return result;
}